

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O2

boolean jpeg_finish_decompress(j_decompress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  int iVar2;
  
  iVar2 = cinfo->global_state;
  if ((iVar2 - 0xcdU < 2) && (cinfo->buffered_image == 0)) {
    if (cinfo->output_scanline < cinfo->output_height) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x45;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    (*cinfo->master->finish_output_pass)(cinfo);
  }
  else {
    if (iVar2 == 0xd2) goto LAB_00107140;
    if (iVar2 != 0xcf) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x15;
      (pjVar1->msg_parm).i[0] = iVar2;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      goto LAB_00107140;
    }
  }
  cinfo->global_state = 0xd2;
LAB_00107140:
  do {
    if (cinfo->inputctl->eoi_reached != 0) {
      (*cinfo->src->term_source)(cinfo);
      jpeg_abort((j_common_ptr)cinfo);
      return 1;
    }
    iVar2 = (*cinfo->inputctl->consume_input)(cinfo);
  } while (iVar2 != 0);
  return 0;
}

Assistant:

GLOBAL(boolean)
jpeg_finish_decompress (j_decompress_ptr cinfo)
{
  if ((cinfo->global_state == DSTATE_SCANNING ||
       cinfo->global_state == DSTATE_RAW_OK) && ! cinfo->buffered_image) {
    /* Terminate final pass of non-buffered mode */
    if (cinfo->output_scanline < cinfo->output_height)
      ERREXIT(cinfo, JERR_TOO_LITTLE_DATA);
    (*cinfo->master->finish_output_pass) (cinfo);
    cinfo->global_state = DSTATE_STOPPING;
  } else if (cinfo->global_state == DSTATE_BUFIMAGE) {
    /* Finishing after a buffered-image operation */
    cinfo->global_state = DSTATE_STOPPING;
  } else if (cinfo->global_state != DSTATE_STOPPING) {
    /* STOPPING = repeat call after a suspension, anything else is error */
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  }
  /* Read until EOI */
  while (! cinfo->inputctl->eoi_reached) {
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return FALSE;		/* Suspend, come back later */
  }
  /* Do final cleanup */
  (*cinfo->src->term_source) (cinfo);
  /* We can use jpeg_abort to release memory and reset global_state */
  jpeg_abort((j_common_ptr) cinfo);
  return TRUE;
}